

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  exception *exc;
  
  rgbaInterfaceExamples();
  generalInterfaceExamples();
  rgbaInterfaceTiledExamples();
  generalInterfaceTiledExamples();
  lowLevelIoExamples();
  previewImageExamples();
  return 0;
}

Assistant:

int
main (int argc, char* argv[])
{
    try
    {
        rgbaInterfaceExamples ();
        generalInterfaceExamples ();

        rgbaInterfaceTiledExamples ();
        generalInterfaceTiledExamples ();

        lowLevelIoExamples ();

        previewImageExamples ();
    }
    catch (const std::exception& exc)
    {
        std::cerr << exc.what () << std::endl;
        return 1;
    }

    return 0;
}